

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall
t_php_generator::generate_deserialize_set_element
          (t_php_generator *this,ostream *out,t_set *tset,string *prefix)

{
  bool bVar1;
  t_type *ptVar2;
  ostream *poVar3;
  t_type *elem_type;
  string local_170;
  string local_150;
  undefined1 local_130 [8];
  t_field felem;
  allocator local_69;
  string local_68;
  undefined1 local_48 [8];
  string elem;
  string *prefix_local;
  t_set *tset_local;
  ostream *out_local;
  t_php_generator *this_local;
  
  elem.field_2._8_8_ = prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"elem",&local_69);
  t_generator::tmp((string *)local_48,(t_generator *)this,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  ptVar2 = t_set::get_elem_type(tset);
  std::__cxx11::string::string((string *)&local_150,(string *)local_48);
  t_field::t_field((t_field *)local_130,ptVar2,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"$");
  poVar3 = std::operator<<(poVar3,(string *)local_48);
  poVar3 = std::operator<<(poVar3," = null;");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"",(allocator *)((long)&elem_type + 7));
  generate_deserialize_field(this,out,(t_field *)local_130,&local_170,false);
  std::__cxx11::string::~string((string *)&local_170);
  std::allocator<char>::~allocator((allocator<char> *)((long)&elem_type + 7));
  ptVar2 = t_set::get_elem_type(tset);
  bVar1 = php_is_scalar(this,ptVar2);
  if (bVar1) {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"$");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,"[$");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3,"] = true;");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    poVar3 = std::operator<<(poVar3,"$");
    poVar3 = std::operator<<(poVar3,(string *)prefix);
    poVar3 = std::operator<<(poVar3,"[] = $");
    poVar3 = std::operator<<(poVar3,(string *)local_48);
    poVar3 = std::operator<<(poVar3,";");
    std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  }
  t_field::~t_field((t_field *)local_130);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void t_php_generator::generate_deserialize_set_element(ostream& out, t_set* tset, string prefix) {
  string elem = tmp("elem");
  t_field felem(tset->get_elem_type(), elem);

  indent(out) << "$" << elem << " = null;" << endl;

  generate_deserialize_field(out, &felem);

  t_type* elem_type = tset->get_elem_type();
  if(php_is_scalar(elem_type)) {
    indent(out) << "$" << prefix << "[$" << elem << "] = true;" << endl;
  } else {
    indent(out) << "$" << prefix << "[] = $" << elem << ";" << endl;
  }
}